

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O2

StatusCode __thiscall HttpConn::parseRequest(HttpConn *this)

{
  int end_idx;
  StatusCode SVar1;
  ParseState PVar2;
  
switchD_00120a28_default:
  switch(this->parseState_) {
  case CheckRequestLine:
    end_idx = findCRLF(this,this->checked_idx_);
    if (end_idx == -1) {
      return Wait;
    }
    SVar1 = parseRequesetLine(this,end_idx);
    PVar2 = CheckHeaders;
    if (SVar1 != OK) {
      if (SVar1 == BadRequest) {
        std::__cxx11::string::assign((char *)&this->body_);
        return BadRequest;
      }
      goto switchD_00120a28_default;
    }
    break;
  case CheckHeaders:
    SVar1 = parseHeader(this);
    PVar2 = CheckBody;
    if (SVar1 != OK) {
      return Wait;
    }
    break;
  case CheckBody:
    goto switchD_00120a28_caseD_2;
  case Finished:
    goto switchD_00120a28_caseD_3;
  default:
    goto switchD_00120a28_default;
  }
  this->parseState_ = PVar2;
  goto switchD_00120a28_default;
switchD_00120a28_caseD_2:
  SVar1 = parseBody(this);
  if (SVar1 != Wait) {
    if (SVar1 != OK) {
      return Wait;
    }
    this->parseState_ = Finished;
    SVar1 = processRequest(this);
    return SVar1;
  }
  goto switchD_00120a28_default;
switchD_00120a28_caseD_3:
  return Wait;
}

Assistant:

HttpConn::StatusCode HttpConn::parseRequest() {
    StatusCode code;
    bool hasMore = true;
    while (hasMore) {
    
        switch (parseState_) {
        case CheckRequestLine: 
        {
            int idx = findCRLF(checked_idx_);
            if (idx != -1) {
                code = parseRequesetLine(idx);
                if (code == OK){ 
                    parseState_ = CheckHeaders; 
                }
                else if (code == BadRequest) { 
                    body_ = "Error Request Line!";
                    return BadRequest; 
                }
            } else {
                hasMore = false;
            }
            break;
        }
        case CheckHeaders:
        {
            code = parseHeader();
            if (code == OK) {
                parseState_ = CheckBody;
            } else if (code == BadRequest) {
                body_  = "Error Header!";
                return BadRequest;
            }
            else hasMore = false;
            break;
        }
        case CheckBody:
        {
            code = parseBody();
            if (code == OK) {
                parseState_ = Finished;
                return processRequest();
            } 
            if (code != Wait)
                hasMore = false;
            break;
        }
        case Finished: hasMore = false; break;

    }

    }
    return Wait;
}